

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O3

ngx_int_t ngx_http_variable_sent_last_modified
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  ngx_table_elt_t *pnVar1;
  u_char *buf;
  u_char *puVar2;
  
  pnVar1 = (r->headers_out).last_modified;
  if (pnVar1 == (ngx_table_elt_t *)0x0) {
    if ((r->headers_out).last_modified_time < 0) {
      v->field_0x3 = v->field_0x3 | 0x40;
    }
    else {
      buf = (u_char *)ngx_pnalloc(r->pool,0x1d);
      if (buf == (u_char *)0x0) {
        return -1;
      }
      puVar2 = ngx_http_time(buf,(r->headers_out).last_modified_time);
      *(uint *)v = ((int)puVar2 - (int)buf & 0xfffffffU) + (*(uint *)v & 0x80000000) + 0x10000000;
      v->data = buf;
    }
  }
  else {
    *(uint *)v = (*(uint *)v & 0x80000000) + ((uint)(pnVar1->value).len & 0xfffffff) + 0x10000000;
    v->data = (((r->headers_out).last_modified)->value).data;
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_sent_last_modified(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char  *p;

    if (r->headers_out.last_modified) {
        v->len = r->headers_out.last_modified->value.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = r->headers_out.last_modified->value.data;

        return NGX_OK;
    }

    if (r->headers_out.last_modified_time >= 0) {
        p = ngx_pnalloc(r->pool, sizeof("Mon, 28 Sep 1970 06:00:00 GMT") - 1);
        if (p == NULL) {
            return NGX_ERROR;
        }

        v->len = ngx_http_time(p, r->headers_out.last_modified_time) - p;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = p;

        return NGX_OK;
    }

    v->not_found = 1;

    return NGX_OK;
}